

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O3

type_conflict2
jsoncons::detail::encode_base64_generic<unsigned_char_const*,std::__cxx11::string>
          (uchar *first,uchar *last,char *alphabet,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  byte bVar1;
  undefined5 uVar2;
  byte bVar3;
  undefined8 in_RAX;
  byte bVar4;
  uint uVar5;
  int iVar6;
  long lVar8;
  char cVar9;
  ulong uVar10;
  type_conflict2 tVar11;
  uchar a3 [3];
  uchar a4 [4];
  undefined8 local_38;
  ulong uVar7;
  
  if (first == last) {
    tVar11 = 0;
  }
  else {
    local_38 = CONCAT17(alphabet[0x40],(int7)in_RAX);
    tVar11 = 0;
    uVar10 = 0;
    do {
      uVar5 = (int)uVar10 + 1;
      uVar7 = (ulong)uVar5;
      *(uchar *)((long)&local_38 + uVar10) = *first;
      uVar10 = local_38;
      cVar9 = (char)result;
      if (uVar5 == 3) {
        bVar1 = (byte)local_38;
        bVar3 = local_38._1_1_;
        bVar4 = (byte)local_38 >> 2;
        local_38._0_4_ = CONCAT13(bVar4,(undefined3)local_38);
        local_38._0_5_ = CONCAT14((bVar1 & 3) << 4 | bVar3 >> 4,(undefined4)local_38);
        uVar2 = (undefined5)local_38;
        local_38._2_1_ = SUB81(uVar10,2);
        bVar1 = local_38._2_1_;
        local_38._0_6_ = CONCAT15((bVar3 & 0xf) << 2 | local_38._2_1_ >> 6,uVar2);
        local_38._7_1_ = SUB81(uVar10,7);
        local_38 = CONCAT17(local_38._7_1_,CONCAT16(bVar1,(undefined6)local_38)) &
                   0xff3fffffffffffff;
        lVar8 = 0;
        do {
          std::__cxx11::string::push_back(cVar9);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        tVar11 = tVar11 + 4;
        uVar7 = 0;
      }
      first = first + 1;
      uVar10 = uVar7;
    } while (first != last);
    uVar5 = (uint)uVar7;
    if (0 < (int)uVar5) {
      if (uVar5 < 3) {
        memset((void *)((long)&local_38 + uVar7),0,(ulong)(3 - uVar5));
      }
      uVar10 = local_38;
      bVar1 = (byte)local_38;
      bVar3 = local_38._1_1_;
      bVar4 = (byte)local_38 >> 2;
      local_38._0_4_ = CONCAT13(bVar4,(undefined3)local_38);
      local_38._0_5_ = CONCAT14((bVar1 & 3) << 4 | bVar3 >> 4,(undefined4)local_38);
      uVar2 = (undefined5)local_38;
      local_38._2_1_ = SUB81(uVar10,2);
      local_38._6_2_ = SUB82(uVar10,6);
      local_38._0_6_ = CONCAT15((bVar3 & 0xf) << 2 | local_38._2_1_ >> 6,uVar2);
      uVar10 = 0;
      do {
        std::__cxx11::string::push_back(cVar9);
        uVar10 = uVar10 + 1;
      } while (uVar5 + 1 != uVar10);
      tVar11 = tVar11 + uVar7 + 1;
      if (local_38._7_1_ != '\0' && uVar5 < 3) {
        iVar6 = uVar5 - 3;
        do {
          std::__cxx11::string::push_back(cVar9);
          tVar11 = tVar11 + 1;
          iVar6 = iVar6 + 1;
        } while (iVar6 != 0);
      }
    }
  }
  return tVar11;
}

Assistant:

typename std::enable_if<std::is_same<typename std::iterator_traits<InputIt>::value_type,uint8_t>::value,size_t>::type
    encode_base64_generic(InputIt first, InputIt last, const char alphabet[65], Container& result)
    {
        std::size_t count = 0;
        unsigned char a3[3];
        unsigned char a4[4];
        unsigned char fill = alphabet[64];
        int i = 0;
        int j = 0;

        while (first != last)
        {
            a3[i++] = *first++;
            if (i == 3)
            {
                a4[0] = (a3[0] & 0xfc) >> 2;
                a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
                a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);
                a4[3] = a3[2] & 0x3f;

                for (i = 0; i < 4; i++) 
                {
                    result.push_back(alphabet[a4[i]]);
                    ++count;
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = i; j < 3; ++j) 
            {
                a3[j] = 0;
            }

            a4[0] = (a3[0] & 0xfc) >> 2;
            a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
            a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);

            for (j = 0; j < i + 1; ++j) 
            {
                result.push_back(alphabet[a4[j]]);
                ++count;
            }

            if (fill != 0)
            {
                while (i++ < 3) 
                {
                    result.push_back(fill);
                    ++count;
                }
            }
        }

        return count;
    }